

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_vec2 nk_window_get_content_region_max(nk_context *ctx)

{
  long lVar1;
  long in_RDI;
  undefined8 local_8;
  
  if ((in_RDI == 0) || (*(long *)(in_RDI + 0x3fc8) == 0)) {
    local_8 = nk_vec2(0.0,0.0);
  }
  else {
    lVar1 = *(long *)(*(long *)(in_RDI + 0x3fc8) + 0xa0);
    local_8 = nk_vec2(*(float *)(lVar1 + 0x3c) + *(float *)(lVar1 + 0x44),
                      *(float *)(lVar1 + 0x40) + *(float *)(lVar1 + 0x48));
  }
  return local_8;
}

Assistant:

NK_API struct nk_vec2
nk_window_get_content_region_max(struct nk_context *ctx)
{
    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    NK_ASSERT(ctx->current->layout);
    if (!ctx || !ctx->current) return nk_vec2(0,0);
    return nk_vec2(ctx->current->layout->clip.x + ctx->current->layout->clip.w,
        ctx->current->layout->clip.y + ctx->current->layout->clip.h);
}